

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grand.c
# Opt level: O2

void g_rand_set_seed_array(GRand *rand,guint32 *seed,guint seed_length)

{
  uint uVar1;
  ulong uVar2;
  guint gVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  g_rand_set_seed(rand,0x12bd6aa);
  gVar3 = 0x270;
  if (0x270 < seed_length) {
    gVar3 = seed_length;
  }
  uVar2 = 1;
  uVar5 = 0;
  while (bVar6 = gVar3 != 0, gVar3 = gVar3 - 1, bVar6) {
    uVar1 = (uint)uVar2;
    rand->mt[uVar2] =
         seed[uVar5] + uVar5 +
         ((rand->mt[uVar1 - 1] >> 0x1e ^ rand->mt[uVar1 - 1]) * 0x19660d ^ rand->mt[uVar2]);
    if (uVar1 < 0x26f) {
      uVar2 = (ulong)(uVar1 + 1);
    }
    else {
      rand->mt[0] = rand->mt[0x26f];
      uVar2 = 1;
    }
    uVar5 = uVar5 + 1;
    if (seed_length <= uVar5) {
      uVar5 = 0;
    }
  }
  for (iVar4 = -0x26f; iVar4 != 0; iVar4 = iVar4 + 1) {
    uVar5 = (uint)uVar2;
    rand->mt[uVar2] =
         ((rand->mt[uVar5 - 1] >> 0x1e ^ rand->mt[uVar5 - 1]) * 0x5d588b65 ^ rand->mt[uVar2]) -
         uVar5;
    if (uVar5 < 0x26f) {
      uVar2 = (ulong)(uVar5 + 1);
    }
    else {
      rand->mt[0] = rand->mt[0x26f];
      uVar2 = 1;
    }
  }
  rand->mt[0] = 0x80000000;
  return;
}

Assistant:

void g_rand_set_seed_array (GRand *rand, const guint32 *seed, guint seed_length)
{
    guint i, j, k;

    g_return_if_fail (rand != NULL);
    g_return_if_fail (seed_length >= 1);

    g_rand_set_seed (rand, 19650218UL);

    i=1; j=0;
    k = (N>seed_length ? N : seed_length);
    for (; k; k--)
    {
        rand->mt[i] = (rand->mt[i] ^
                ((rand->mt[i-1] ^ (rand->mt[i-1] >> 30)) * 1664525UL))
            + seed[j] + j; /* non linear */
        rand->mt[i] &= 0xffffffffUL; /* for WORDSIZE > 32 machines */
        i++; j++;
        if (i>=N)
        {
            rand->mt[0] = rand->mt[N-1];
            i=1;
        }
        if (j>=seed_length)
            j=0;
    }
    for (k=N-1; k; k--)
    {
        rand->mt[i] = (rand->mt[i] ^
                ((rand->mt[i-1] ^ (rand->mt[i-1] >> 30)) * 1566083941UL))
            - i; /* non linear */
        rand->mt[i] &= 0xffffffffUL; /* for WORDSIZE > 32 machines */
        i++;
        if (i>=N)
        {
            rand->mt[0] = rand->mt[N-1];
            i=1;
        }
    }

    rand->mt[0] = 0x80000000UL; /* MSB is 1; assuring non-zero initial array */ 
}